

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cpp
# Opt level: O3

void indk::Profiler::doAttachCallback(NeuralNet *object,int flag,ProfilerCallback *callback)

{
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  int local_58;
  pair<indk::NeuralNet_*,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_> local_50;
  
  std::function<void_(indk::NeuralNet_*)>::function
            ((function<void_(indk::NeuralNet_*)> *)&local_78,callback);
  local_50.second.first.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_50.second.first.super__Function_base._M_functor._8_8_ = 0;
  local_50.second.first.super__Function_base._M_manager = (_Manager_type)0x0;
  local_50.second.first._M_invoker = p_Stack_60;
  if (local_68 != (_Manager_type)0x0) {
    local_50.second.first.super__Function_base._M_functor._M_unused._M_object =
         local_78._M_unused._M_object;
    local_50.second.first.super__Function_base._M_functor._8_8_ = local_78._8_8_;
    local_50.second.first.super__Function_base._M_manager = local_68;
    local_68 = (_Manager_type)0x0;
    p_Stack_60 = (_Invoker_type)0x0;
  }
  local_58 = flag;
  local_50.first = object;
  local_50.second.second = flag;
  std::
  _Rb_tree<indk::NeuralNet*,std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>,std::_Select1st<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>,std::less<indk::NeuralNet*>,std::allocator<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>>
  ::
  _M_emplace_equal<std::pair<indk::NeuralNet*,std::pair<std::function<void(indk::NeuralNet*)>,int>>>
            ((_Rb_tree<indk::NeuralNet*,std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>,std::_Select1st<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>,std::less<indk::NeuralNet*>,std::allocator<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>>
              *)&Callbacks,&local_50);
  if (local_50.second.first.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.second.first.super__Function_base._M_manager)
              ((_Any_data *)&local_50.second,(_Any_data *)&local_50.second,__destroy_functor);
  }
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  return;
}

Assistant:

void indk::Profiler::doAttachCallback(indk::NeuralNet *object, int flag, indk::ProfilerCallback callback) {
    Callbacks.insert(std::make_pair(object, std::make_pair(callback, flag)));
}